

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_copy(lua_State *L)

{
  long lVar1;
  lua_State *L_00;
  void *__src;
  long in_RDI;
  CTSize len;
  TValue *o;
  void *sp;
  void *dp;
  undefined4 local_24;
  undefined8 in_stack_ffffffffffffffe8;
  lua_State *in_stack_fffffffffffffff0;
  
  L_00 = (lua_State *)
         ffi_checkptr(in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                      (CTypeID)in_stack_ffffffffffffffe8);
  __src = ffi_checkptr(L_00,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                       (CTypeID)in_stack_ffffffffffffffe8);
  lVar1 = *(long *)(in_RDI + 0x10);
  if ((*(int *)(lVar1 + 0xc) == -5) && (*(ulong *)(in_RDI + 0x18) <= lVar1 + 0x10U)) {
    local_24 = *(int *)((ulong)*(uint *)(lVar1 + 8) + 0xc) + 1;
  }
  else {
    local_24 = ffi_checkint(L_00,(int)((ulong)__src >> 0x20));
  }
  memcpy(L_00,__src,(ulong)local_24);
  return 0;
}

Assistant:

LJLIB_CF(ffi_copy)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  void *sp = ffi_checkptr(L, 2, CTID_P_CVOID);
  TValue *o = L->base+1;
  CTSize len;
  if (tvisstr(o) && o+1 >= L->top)
    len = strV(o)->len+1;  /* Copy Lua string including trailing '\0'. */
  else
    len = (CTSize)ffi_checkint(L, 3);
  memcpy(dp, sp, len);
  return 0;
}